

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

uint32_t __thiscall capnp::ConstSchema::getValueSchemaOffset(ConstSchema *this)

{
  uint32_t uVar1;
  Reader local_a8;
  Reader local_70;
  Reader local_40;
  
  Schema::getProto(&local_70,&this->super_Schema);
  local_a8._reader.dataSize = local_70._reader.dataSize;
  local_a8._reader.pointerCount = local_70._reader.pointerCount;
  local_a8._reader._38_2_ = local_70._reader._38_2_;
  local_a8._reader.nestingLimit = local_70._reader.nestingLimit;
  local_a8._reader._44_4_ = local_70._reader._44_4_;
  local_a8._reader.data = local_70._reader.data;
  local_a8._reader.pointers = local_70._reader.pointers;
  local_a8._reader.segment = local_70._reader.segment;
  local_a8._reader.capTable = local_70._reader.capTable;
  capnp::schema::Node::Const::Reader::getValue(&local_40,&local_a8);
  uVar1 = Schema::getSchemaOffset(&this->super_Schema,&local_40);
  return uVar1;
}

Assistant:

uint32_t ConstSchema::getValueSchemaOffset() const {
  return getSchemaOffset(getProto().getConst().getValue());
}